

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow *window,ImRect *item_rect)

{
  ImVec2 IVar1;
  undefined1 auVar2 [16];
  ImGuiContext *pIVar3;
  undefined4 in_EAX;
  int iVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  ImRect local_20;
  
  pIVar3 = GImGui;
  fVar6 = (window->InnerRect).Min.x + -1.0;
  fVar7 = (window->InnerRect).Min.y + -1.0;
  fVar8 = (window->InnerRect).Max.x + 1.0;
  fVar9 = (window->InnerRect).Max.y + 1.0;
  fVar5 = (item_rect->Min).x;
  auVar2._4_4_ = -(uint)(fVar7 <= (item_rect->Min).y);
  auVar2._0_4_ = -(uint)(fVar6 <= fVar5);
  auVar2._8_4_ = -(uint)((item_rect->Max).x <= fVar8);
  auVar2._12_4_ = -(uint)((item_rect->Max).y <= fVar9);
  iVar4 = movmskps(in_EAX,auVar2);
  if (iVar4 == 0xf) {
    fVar5 = 0.0;
    fVar6 = 0.0;
    goto LAB_001e3774;
  }
  if (fVar6 <= fVar5 || window->ScrollbarX != true) {
    if ((window->ScrollbarX != false) && (fVar5 = (item_rect->Max).x, fVar8 <= fVar5)) {
      fVar5 = (fVar5 - (window->Pos).x) + (GImGui->Style).ItemSpacing.x;
      fVar6 = 1.0;
      goto LAB_001e36cf;
    }
  }
  else {
    fVar5 = (fVar5 - (window->Pos).x) - (GImGui->Style).ItemSpacing.x;
    fVar6 = 0.0;
LAB_001e36cf:
    (window->ScrollTarget).x = (float)(int)(fVar5 + (window->Scroll).x);
    (window->ScrollTargetCenterRatio).x = fVar6;
    (window->ScrollTargetEdgeSnapDist).x = 0.0;
  }
  fVar5 = (item_rect->Min).y;
  if (fVar7 <= fVar5) {
    fVar5 = (item_rect->Max).y;
    if (fVar9 <= fVar5) {
      fVar5 = (fVar5 - (window->Pos).y) + (pIVar3->Style).ItemSpacing.y;
      fVar6 = 1.0;
      goto LAB_001e3758;
    }
  }
  else {
    fVar5 = (fVar5 - (window->Pos).y) - (pIVar3->Style).ItemSpacing.y;
    fVar6 = 0.0;
LAB_001e3758:
    SetScrollFromPosY(window,fVar5,fVar6);
  }
  IVar1 = CalcNextScrollFromScrollTargetAndClamp(window);
  fVar5 = IVar1.x - (window->Scroll).x;
  fVar6 = IVar1.y - (window->Scroll).y;
LAB_001e3774:
  if ((window->Flags & 0x1000000) != 0) {
    local_20.Min.x = (item_rect->Min).x - fVar5;
    local_20.Min.y = (item_rect->Min).y - fVar6;
    local_20.Max.x = (item_rect->Max).x - fVar5;
    local_20.Max.y = (item_rect->Max).y - fVar6;
    IVar1 = ScrollToBringRectIntoView(window->ParentWindow,&local_20);
    fVar5 = fVar5 + IVar1.x;
    fVar6 = fVar6 + IVar1.y;
  }
  IVar1.y = fVar6;
  IVar1.x = fVar5;
  return IVar1;
}

Assistant:

ImVec2 ImGui::ScrollToBringRectIntoView(ImGuiWindow* window, const ImRect& item_rect)
{
    ImGuiContext& g = *GImGui;
    ImRect window_rect(window->InnerRect.Min - ImVec2(1, 1), window->InnerRect.Max + ImVec2(1, 1));
    //GetForegroundDrawList(window)->AddRect(window_rect.Min, window_rect.Max, IM_COL32_WHITE); // [DEBUG]

    ImVec2 delta_scroll;
    if (!window_rect.Contains(item_rect))
    {
        if (window->ScrollbarX && item_rect.Min.x < window_rect.Min.x)
            SetScrollFromPosX(window, item_rect.Min.x - window->Pos.x - g.Style.ItemSpacing.x, 0.0f);
        else if (window->ScrollbarX && item_rect.Max.x >= window_rect.Max.x)
            SetScrollFromPosX(window, item_rect.Max.x - window->Pos.x + g.Style.ItemSpacing.x, 1.0f);
        if (item_rect.Min.y < window_rect.Min.y)
            SetScrollFromPosY(window, item_rect.Min.y - window->Pos.y - g.Style.ItemSpacing.y, 0.0f);
        else if (item_rect.Max.y >= window_rect.Max.y)
            SetScrollFromPosY(window, item_rect.Max.y - window->Pos.y + g.Style.ItemSpacing.y, 1.0f);

        ImVec2 next_scroll = CalcNextScrollFromScrollTargetAndClamp(window);
        delta_scroll = next_scroll - window->Scroll;
    }

    // Also scroll parent window to keep us into view if necessary
    if (window->Flags & ImGuiWindowFlags_ChildWindow)
        delta_scroll += ScrollToBringRectIntoView(window->ParentWindow, ImRect(item_rect.Min - delta_scroll, item_rect.Max - delta_scroll));

    return delta_scroll;
}